

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_compressionParameters *
ZSTD_adjustCParams(ZSTD_compressionParameters *__return_storage_ptr__,
                  ZSTD_compressionParameters cPar,unsigned_long_long srcSize,size_t dictSize)

{
  ZSTD_compressionParameters cPar_00;
  ZSTD_strategy ZVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = 0x1f;
  if ((int)cPar.windowLog < 0x1f) {
    uVar3 = cPar.windowLog;
  }
  uVar2 = 10;
  if (10 < (int)uVar3) {
    uVar2 = uVar3;
  }
  if (0x1d < (int)cPar.chainLog) {
    cPar.chainLog = 0x1e;
  }
  if ((int)cPar.chainLog < 7) {
    cPar.chainLog = 6;
  }
  if (0x1d < (int)cPar.hashLog) {
    cPar.hashLog = 0x1e;
  }
  if ((int)cPar.hashLog < 7) {
    cPar.hashLog = 6;
  }
  uVar3 = 0x1e;
  if ((int)cPar.searchLog < 0x1e) {
    uVar3 = cPar.searchLog;
  }
  if ((int)uVar3 < 2) {
    uVar3 = 1;
  }
  uVar4 = 7;
  if ((int)cPar.minMatch < 7) {
    uVar4 = cPar.minMatch;
  }
  if ((int)uVar4 < 4) {
    uVar4 = 3;
  }
  uVar5 = 0x20000;
  if ((int)cPar.targetLength < 0x20000) {
    uVar5 = cPar.targetLength;
  }
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  ZVar1 = ZSTD_btultra2;
  if ((int)cPar.strategy < 9) {
    ZVar1 = cPar.strategy;
  }
  if ((int)ZVar1 < 2) {
    ZVar1 = ZSTD_fast;
  }
  cPar_00.strategy = ZVar1;
  cPar_00.targetLength = uVar5;
  cPar_00.chainLog = cPar.chainLog;
  cPar_00.windowLog = uVar2;
  cPar_00.hashLog = cPar.hashLog;
  cPar_00.searchLog = uVar3;
  cPar_00.minMatch = uVar4;
  ZSTD_adjustCParams_internal
            (__return_storage_ptr__,cPar_00,srcSize | -(ulong)(srcSize == 0),dictSize,
             ZSTD_cpm_unknown,ZSTD_ps_auto);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_clampCParams(ZSTD_compressionParameters cParams)
{
#   define CLAMP_TYPE(cParam, val, type) {                                \
        ZSTD_bounds const bounds = ZSTD_cParam_getBounds(cParam);         \
        if ((int)val<bounds.lowerBound) val=(type)bounds.lowerBound;      \
        else if ((int)val>bounds.upperBound) val=(type)bounds.upperBound; \
    }
#   define CLAMP(cParam, val) CLAMP_TYPE(cParam, val, unsigned)
    CLAMP(ZSTD_c_windowLog, cParams.windowLog);
    CLAMP(ZSTD_c_chainLog,  cParams.chainLog);
    CLAMP(ZSTD_c_hashLog,   cParams.hashLog);
    CLAMP(ZSTD_c_searchLog, cParams.searchLog);
    CLAMP(ZSTD_c_minMatch,  cParams.minMatch);
    CLAMP(ZSTD_c_targetLength,cParams.targetLength);
    CLAMP_TYPE(ZSTD_c_strategy,cParams.strategy, ZSTD_strategy);
    return cParams;
}